

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O2

string * __thiscall
absl::flags_internal::Unparse_abi_cxx11_(string *__return_storage_ptr__,flags_internal *this,long v)

{
  AlphaNum *a;
  AlphaNum local_40;
  
  AlphaNum::AlphaNum(&local_40,(long)this);
  StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_40,a);
  return __return_storage_ptr__;
}

Assistant:

std::string Unparse(long v) { return absl::StrCat(v); }